

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O3

void __thiscall KV::KeyValues::setKeyValue(KeyValues *this,string *kvValue)

{
  _Rb_tree_header *p_Var1;
  KeyValues *pKVar2;
  _Rb_tree_node_base *p_Var3;
  
  if ((this->value).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == false) {
    p_Var3 = (this->keyvalues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->keyvalues)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      pKVar2 = this->parentKV;
      do {
        *(KeyValues **)(*(long *)(p_Var3 + 2) + 0x30) = pKVar2;
        *(long *)(*(long *)(p_Var3 + 2) + 0x38) = *(long *)(*(long *)(p_Var3 + 2) + 0x38) + -1;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
  }
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)&this->value,kvValue);
  return;
}

Assistant:

void KeyValues::setKeyValue( const std::string &kvValue )
	{
		if ( isSection() )
		{
			for ( auto &kv : keyvalues )
			{
				kv.second->parentKV = parentKV;
				--kv.second->depth;
			}
		}

		value = kvValue;
	}